

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall
kj::Directory::transfer
          (Directory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,PathPtr fromPath
          ,TransferMode mode)

{
  int iVar1;
  Fault f;
  PathPtr toPath_local;
  
  toPath_local.parts.size_ = toPath.parts.size_;
  toPath_local.parts.ptr = toPath.parts.ptr;
  iVar1 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])();
  if ((char)iVar1 == '\0') {
    if ((toMode & CREATE) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x282,FAILED,(char *)0x0,"\"fromPath doesn\'t exist\", fromPath",
                 (char (*) [23])0x57e55f,&fromPath);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48],kj::PathPtr&,kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x27e,FAILED,(char *)0x0,
                 "\"toPath already exists or fromPath doesn\'t exist\", toPath, fromPath",
                 (char (*) [48])"toPath already exists or fromPath doesn\'t exist",&toPath_local,
                 &fromPath);
    }
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void Directory::transfer(PathPtr toPath, WriteMode toMode,
                         const Directory& fromDirectory, PathPtr fromPath,
                         TransferMode mode) const {
  if (!tryTransfer(toPath, toMode, fromDirectory, fromPath, mode)) {
    if (has(toMode, WriteMode::CREATE)) {
      KJ_FAIL_REQUIRE("toPath already exists or fromPath doesn't exist", toPath, fromPath) {
        break;
      }
    } else {
      KJ_FAIL_ASSERT("fromPath doesn't exist", fromPath) { break; }
    }
  }
}